

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-server.c
# Opt level: O2

SshChannel * ssh2_serverside_x11_open(ConnectionLayer *cl,Channel *chan,SocketPeerInfo *pi)

{
  BinarySink *bs;
  LogContext *ctx;
  ssh2_channel *c;
  char *pcVar1;
  PktOut *pPVar2;
  unsigned_long val;
  
  val = 0;
  c = (ssh2_channel *)safemalloc(1,0xc0,0);
  c->connlayer = (ssh2_connection_state *)&cl[-0xe].vt;
  ssh2_channel_init(c);
  c->halfopen = true;
  c->chan = chan;
  ctx = cl[5].logctx;
  pcVar1 = dupprintf("Forwarding X11 channel to client");
  logevent_and_free(ctx,pcVar1);
  pPVar2 = ssh2_chanopen_init(c,"x11");
  bs = pPVar2->binarysink_;
  if (pi == (SocketPeerInfo *)0x0) {
    BinarySink_put_stringz(bs,"0.0.0.0");
    val = 0;
  }
  else {
    pcVar1 = "0.0.0.0";
    if (pi->addr_text != (char *)0x0) {
      pcVar1 = pi->addr_text;
    }
    BinarySink_put_stringz(bs,pcVar1);
    if (0 < pi->port) {
      val = (unsigned_long)(uint)pi->port;
    }
  }
  BinarySink_put_uint32(bs,val);
  pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar2->qnode);
  return &c->sc;
}

Assistant:

SshChannel *ssh2_serverside_x11_open(
    ConnectionLayer *cl, Channel *chan, const SocketPeerInfo *pi)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    struct ssh2_channel *c = snew(struct ssh2_channel);
    PktOut *pktout;

    c->connlayer = s;
    ssh2_channel_init(c);
    c->halfopen = true;
    c->chan = chan;

    ppl_logevent("Forwarding X11 channel to client");

    pktout = ssh2_chanopen_init(c, "x11");
    put_stringz(pktout, (pi && pi->addr_text ? pi->addr_text : "0.0.0.0"));
    put_uint32(pktout, (pi && pi->port >= 0 ? pi->port : 0));
    pq_push(s->ppl.out_pq, pktout);

    return &c->sc;
}